

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O1

void __thiscall
glcts::BlendTestCaseGroup::BlendTest::BlendTest
          (BlendTest *this,Context *context,GLSLVersion glslVersion,GLenum mode,bool useAllQualifier
          ,int numColors,GLfloat *colors)

{
  char *__s;
  long *plVar1;
  long *plVar2;
  allocator<char> local_75;
  int local_74;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_74 = numColors;
  __s = GetModeStr(mode);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,__s,&local_75);
  plVar1 = (long *)std::__cxx11::string::append((char *)local_50);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_60 = *plVar2;
    lStack_58 = plVar1[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar2;
    local_70 = (long *)*plVar1;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,(char *)local_70,
             "Test new blend modes for correctness.");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_021043a0;
  (this->super_TestCase).m_context = context;
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_02150660;
  this->m_glslVersion = glslVersion;
  this->m_mode = mode;
  this->m_useAllQualifier = useAllQualifier;
  this->m_numColors = local_74;
  this->m_colors = colors;
  return;
}

Assistant:

BlendTest(deqp::Context& context, glu::GLSLVersion glslVersion, glw::GLenum mode, bool useAllQualifier,
				  int numColors, const glw::GLfloat* colors)
			: TestCase(context, (std::string(GetModeStr(mode)) + (useAllQualifier ? "_all_qualifier" : "")).c_str(),
					   "Test new blend modes for correctness.")
			, m_glslVersion(glslVersion)
			, m_mode(mode)
			, m_useAllQualifier(useAllQualifier)
			, m_numColors(numColors)
			, m_colors(colors)
		{
		}